

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

int __thiscall NodeBTree::lessThanKeyCompareOp(NodeBTree *this,KeyType *key,uint8_t *data)

{
  uint64_t uVar1;
  uint8_t *local_10;
  
  local_10 = data;
  uVar1 = decodeBitsAndAdvance(&local_10);
  return -(uint)(key->m_nodeIndex < (uint)uVar1) | 1;
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nodeIndex() < nodeIndex)
			return -1;
		else if (key.nodeIndex() > nodeIndex)
			return 1;
		else
			UNREACHABLE_CODE(0xDEAD);
	}